

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Reset
          (GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *this)

{
  Vector *pVVar1;
  uint i;
  ulong uVar2;
  
  this->total = 0;
  ChunkedStackPool<65532>::Reset(this->pool);
  pVVar1 = &this->largeObjects;
  for (uVar2 = 0; uVar2 < (this->largeObjects).count; uVar2 = uVar2 + 1) {
    (*(code *)NULLC::dealloc)(pVVar1->data[uVar2]);
  }
  if (pVVar1->data != (void **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  pVVar1->data = (void **)0x0;
  (this->largeObjects).max = 0;
  (this->largeObjects).count = 0;
  return;
}

Assistant:

void Reset()
	{
		total = 0;

		pool.Reset();

		for(unsigned i = 0; i < largeObjects.count; i++)
			NULLC::dealloc(largeObjects.data[i]);
		largeObjects.reset();
	}